

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O1

vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> * __thiscall
deqp::egl::ConfigFilter::filter
          (vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
           *__return_storage_ptr__,ConfigFilter *this,
          vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *configs)

{
  iterator __position;
  bool bVar1;
  pointer config;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  config = (configs->
           super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (config != (configs->
                super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      bVar1 = isMatch(this,config);
      if (bVar1) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<deqp::egl::SurfaceConfig,std::allocator<deqp::egl::SurfaceConfig>>::
          _M_realloc_insert<deqp::egl::SurfaceConfig_const&>
                    ((vector<deqp::egl::SurfaceConfig,std::allocator<deqp::egl::SurfaceConfig>> *)
                     __return_storage_ptr__,__position,config);
        }
        else {
          memcpy(__position._M_current,config,0xa0);
          (__return_storage_ptr__->
          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>).
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      config = config + 1;
    } while (config != (configs->
                       super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SurfaceConfig> filter (const std::vector<SurfaceConfig>& configs) const
	{
		std::vector<SurfaceConfig> out;

		for (std::vector<SurfaceConfig>::const_iterator iter = configs.begin(); iter != configs.end(); iter++)
		{
			if (isMatch(*iter)) out.push_back(*iter);
		}

		return out;
	}